

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crl.cc
# Opt level: O3

CRLRevocationStatus
bssl::CheckCRL(string_view raw_crl,ParsedCertificateList *valid_chain,size_t target_cert_index,
              ParsedDistributionPoint *cert_dp,int64_t verify_time_epoch_seconds,
              optional<long> max_age_seconds)

{
  element_type *peVar1;
  _Head_base<0UL,_bssl::GeneralNames_*,_false> _Var2;
  long lVar3;
  Input tbs_tlv;
  Input signed_data;
  Input lhs;
  Input lhs_00;
  Input algorithm_identifier;
  Input algorithm_identifier_00;
  Input name_tlv;
  bool bVar4;
  CRLRevocationStatus CVar5;
  optional<bssl::SignatureAlgorithm> oVar6;
  _Base_ptr p_Var7;
  pointer psVar8;
  GeneralizedTime *this_update;
  _Storage<long,_true> extension;
  optional<bssl::der::Input> *revoked_certificates_tlv;
  int64_t iVar9;
  long lVar10;
  ulong uVar11;
  Input crl_tlv;
  Input oid;
  Input extension_value;
  Input cert_serial;
  optional<long> max_age_seconds_00;
  unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> distribution_point_names;
  ContainedCertsType only_contains_cert_type;
  Input tbs_cert_list_tlv;
  string normalized_crl_issuer;
  map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
  extensions;
  Input signature_algorithm_tlv;
  ParsedCrlTbsCertList tbs_cert_list;
  BitString signature_value;
  ParsedExtension idp_extension;
  _Head_base<0UL,_bssl::GeneralNames_*,_false> local_1a0;
  undefined1 local_194 [12];
  uchar *local_188;
  size_t sStack_180;
  string local_178;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_158;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_140;
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
  local_128;
  Input local_f8;
  undefined1 local_e8 [48];
  GeneralizedTime local_b8;
  bool local_b0;
  undefined1 local_a8 [16];
  bool local_98;
  _Storage<bssl::der::Input,_true> local_90;
  bool local_80;
  BitString local_78;
  undefined8 local_58;
  _Rb_tree_node_base _Stack_50;
  
  psVar8 = (valid_chain->
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(valid_chain->
                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4) <=
      target_cert_index) {
    abort();
  }
  if ((cert_dp->reasons).super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::der::Input>._M_engaged != false) {
    return MAX_VALUE;
  }
  if ((cert_dp->crl_issuer).super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::der::Input>._M_engaged != false) {
    return MAX_VALUE;
  }
  lVar10 = target_cert_index * 0x10;
  peVar1 = psVar8[target_cert_index].
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188 = (uchar *)0x0;
  sStack_180 = 0;
  local_f8.data_.data_ = (uchar *)0x0;
  local_f8.data_.size_ = 0;
  local_78.bytes_.data_.data_ = (uchar *)0x0;
  local_78.bytes_.data_.size_ = 0;
  local_78.unused_bits_ = '\0';
  crl_tlv.data_.size_ = (size_t)&local_188;
  crl_tlv.data_.data_ = (uchar *)raw_crl._M_len;
  iVar9 = verify_time_epoch_seconds;
  bVar4 = ParseCrlCertificateList
                    ((bssl *)raw_crl._M_str,crl_tlv,&local_f8,&local_78.bytes_,
                     (BitString *)verify_time_epoch_seconds);
  if (!bVar4) {
    return MAX_VALUE;
  }
  local_e8._0_4_ = V1;
  local_b0 = false;
  local_98 = false;
  local_80 = false;
  local_e8._8_8_ = (uchar *)0x0;
  local_e8._16_8_ = 0;
  local_e8._24_8_ = (uchar *)0x0;
  local_e8._32_8_ = 0;
  tbs_tlv.data_.size_ = sStack_180;
  tbs_tlv.data_.data_ = local_188;
  bVar4 = ParseCrlTbsCertList(tbs_tlv,(ParsedCrlTbsCertList *)local_e8);
  if (!bVar4) {
    return MAX_VALUE;
  }
  algorithm_identifier.data_.size_ = local_f8.data_.size_;
  algorithm_identifier.data_.data_ = local_f8.data_.data_;
  local_194._4_8_ = ParseSignatureAlgorithm(algorithm_identifier);
  if (((ulong)local_194._4_8_ >> 0x20 & 1) == 0) {
    return MAX_VALUE;
  }
  algorithm_identifier_00.data_.size_ = local_e8._16_8_;
  algorithm_identifier_00.data_.data_ = (uchar *)local_e8._8_8_;
  oVar6 = ParseSignatureAlgorithm(algorithm_identifier_00);
  if (local_194._4_4_ !=
      oVar6.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload ||
      ((ulong)oVar6.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
              super__Optional_payload_base<bssl::SignatureAlgorithm> & 0x100000000) == 0) {
    return MAX_VALUE;
  }
  this_update = (GeneralizedTime *)0x0;
  if (local_b0 != false) {
    this_update = &local_b8;
  }
  extension._M_value._4_4_ = 0;
  extension._M_value._0_4_ =
       max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._8_4_;
  max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._8_8_ = iVar9;
  max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = extension._M_value;
  bVar4 = CheckRevocationDateValid
                    ((bssl *)(local_e8 + 0x28),this_update,
                     (GeneralizedTime *)verify_time_epoch_seconds,
                     max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload._M_value,max_age_seconds_00);
  if (!bVar4) {
    return MAX_VALUE;
  }
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  name_tlv.data_.size_ = local_e8._32_8_;
  name_tlv.data_.data_ = (uchar *)local_e8._24_8_;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  bVar4 = anon_unknown_0::NormalizeNameTLV(name_tlv,&local_178);
  CVar5 = MAX_VALUE;
  if ((!bVar4) ||
     (lhs.data_.size_ = local_178._M_string_length,
     lhs.data_.data_ = (uchar *)local_178._M_dataplus._M_p,
     bVar4 = der::operator!=(lhs,(Input)*(Span<const_unsigned_char> *)&peVar1->normalized_issuer_),
     bVar4)) goto LAB_004a0bca;
  if (local_80 == true) {
    local_128._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_128._M_impl.super__Rb_tree_header._M_header;
    local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_128._M_impl.super__Rb_tree_header._M_header._M_right =
         local_128._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar4 = ParseExtensions(local_90._M_value,
                            (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                             *)&local_128);
    if (bVar4) {
      _Stack_50._M_parent = (_Base_ptr)0x0;
      _Stack_50._M_left = (_Base_ptr)0x0;
      local_58 = 0;
      _Stack_50._M_color = _S_red;
      _Stack_50._4_4_ = 0;
      _Stack_50._M_right._0_1_ = 0;
      oid.data_.size_ = (size_t)&local_128;
      oid.data_.data_ = (uchar *)0x3;
      bVar4 = ConsumeExtension((bssl *)&(anonymous_namespace)::kIssuingDistributionPointOid,oid,
                               (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                                *)&local_58,(ParsedExtension *)extension);
      if (!bVar4) {
LAB_004a0aa5:
        for (p_Var7 = local_128._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &local_128._M_impl.super__Rb_tree_header;
            p_Var7 = (_Base_ptr)::std::_Rb_tree_increment(p_Var7)) {
          if (*(char *)&p_Var7[2]._M_left != '\0') goto LAB_004a0ad4;
        }
        ::std::
        _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
        ::~_Rb_tree(&local_128);
        goto LAB_004a0af3;
      }
      local_1a0._M_head_impl = (GeneralNames *)0x0;
      extension_value.data_.size_ = (size_t)&local_1a0;
      extension_value.data_.data_ = (uchar *)_Stack_50._M_left;
      bVar4 = ParseIssuingDistributionPoint
                        ((bssl *)_Stack_50._M_parent,extension_value,
                         (unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> *
                         )local_194,(ContainedCertsType *)extension);
      if (bVar4) {
        if (local_1a0._M_head_impl == (GeneralNames *)0x0) {
LAB_004a0a48:
          if (local_194._0_4_ == 2) {
            if ((peVar1->has_basic_constraints_ == true) &&
               ((peVar1->basic_constraints_).is_ca == true)) goto LAB_004a0a9b;
          }
          else if ((local_194._0_4_ != 1) ||
                  (((peVar1->has_basic_constraints_ != true ||
                    ((peVar1->basic_constraints_).is_ca == false)) && (V2 < (peVar1->tbs_).version))
                  )) {
LAB_004a0a9b:
            ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
            ~unique_ptr((unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> *)
                        &local_1a0);
            goto LAB_004a0aa5;
          }
        }
        else {
          _Var2._M_head_impl =
               (cert_dp->distribution_point_fullname)._M_t.
               super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>.
               _M_t.
               super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
               .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl;
          if (_Var2._M_head_impl != (GeneralNames *)0x0) {
            ::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::vector(&local_140,&(_Var2._M_head_impl)->uniform_resource_identifiers);
            ::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::vector(&local_158,&(local_1a0._M_head_impl)->uniform_resource_identifiers);
            bVar4 = anon_unknown_0::ContainsExactMatchingName(&local_140,&local_158);
            if (local_158.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_158.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_158.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_158.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_140.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_140.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_140.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_140.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar4) goto LAB_004a0a48;
          }
        }
      }
      ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::~unique_ptr
                ((unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> *)
                 &local_1a0);
    }
LAB_004a0ad4:
    ::std::
    _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
    ::~_Rb_tree(&local_128);
  }
  else {
LAB_004a0af3:
    uVar11 = target_cert_index + 1;
    psVar8 = (valid_chain->
             super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar11 < (ulong)((long)(valid_chain->
                               super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4)) {
      do {
        lVar3 = *(long *)((long)&psVar8[1].
                                 super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar10);
        lhs_00.data_.size_ = local_178._M_string_length;
        lhs_00.data_.data_ = (uchar *)local_178._M_dataplus._M_p;
        bVar4 = der::operator!=(lhs_00,(Input)*(Span<const_unsigned_char> *)(lVar3 + 0x118));
        if ((!bVar4) &&
           ((*(char *)(lVar3 + 0x15c) != '\x01' ||
            (bVar4 = der::BitString::AssertsBit((BitString *)(lVar3 + 0x160),6), bVar4)))) {
          signed_data.data_.size_ = sStack_180;
          signed_data.data_.data_ = local_188;
          revoked_certificates_tlv =
               (optional<bssl::der::Input> *)((Span<const_unsigned_char> *)(lVar3 + 0xa8))->data_;
          bVar4 = VerifySignedData((SignatureAlgorithm)local_194._4_8_,signed_data,&local_78,
                                   (Input)*(Span<const_unsigned_char> *)(lVar3 + 0xa8),
                                   (SignatureVerifyCache *)0x0);
          if (bVar4) {
            cert_serial.data_.size_._0_4_ = local_e8._0_4_;
            cert_serial.data_.data_ = (uchar *)*(size_t *)((long)&peVar1->tbs_ + 0x10);
            cert_serial.data_.size_._4_4_ = 0;
            CVar5 = GetCRLStatusForCert(*(bssl **)&((Input *)((long)&peVar1->tbs_ + 8))->data_,
                                        cert_serial,(CrlVersion)local_a8,revoked_certificates_tlv);
            break;
          }
        }
        uVar11 = uVar11 + 1;
        psVar8 = (valid_chain->
                 super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x10;
      } while (uVar11 < (ulong)((long)(valid_chain->
                                      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >>
                               4));
    }
  }
LAB_004a0bca:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  return CVar5;
}

Assistant:

CRLRevocationStatus CheckCRL(std::string_view raw_crl,
                             const ParsedCertificateList &valid_chain,
                             size_t target_cert_index,
                             const ParsedDistributionPoint &cert_dp,
                             int64_t verify_time_epoch_seconds,
                             std::optional<int64_t> max_age_seconds) {
  BSSL_CHECK(target_cert_index < valid_chain.size());

  if (cert_dp.reasons) {
    // Reason codes are not supported. If the distribution point contains a
    // subset of reasons then skip it. We aren't interested in subsets of CRLs
    // and the RFC states that there MUST be a CRL that covers all reasons.
    return CRLRevocationStatus::UNKNOWN;
  }
  if (cert_dp.crl_issuer) {
    // Indirect CRLs are not supported.
    return CRLRevocationStatus::UNKNOWN;
  }

  const ParsedCertificate *target_cert = valid_chain[target_cert_index].get();

  // 6.3.3 (a) Update the local CRL cache by obtaining a complete CRL, a
  //           delta CRL, or both, as required.
  //
  // This implementation only supports complete CRLs and takes the CRL as
  // input, it is up to the caller to provide an up to date CRL.

  der::Input tbs_cert_list_tlv;
  der::Input signature_algorithm_tlv;
  der::BitString signature_value;
  if (!ParseCrlCertificateList(StringAsBytes(raw_crl), &tbs_cert_list_tlv,
                               &signature_algorithm_tlv, &signature_value)) {
    return CRLRevocationStatus::UNKNOWN;
  }

  ParsedCrlTbsCertList tbs_cert_list;
  if (!ParseCrlTbsCertList(tbs_cert_list_tlv, &tbs_cert_list)) {
    return CRLRevocationStatus::UNKNOWN;
  }

  // 5.1.1.2  signatureAlgorithm
  //
  // TODO(https://crbug.com/749276): Check the signature algorithm against
  // policy.
  std::optional<SignatureAlgorithm> signature_algorithm =
      ParseSignatureAlgorithm(signature_algorithm_tlv);
  if (!signature_algorithm) {
    return CRLRevocationStatus::UNKNOWN;
  }

  //    This field MUST contain the same algorithm identifier as the
  //    signature field in the sequence tbsCertList (Section 5.1.2.2).
  std::optional<SignatureAlgorithm> tbs_alg =
      ParseSignatureAlgorithm(tbs_cert_list.signature_algorithm_tlv);
  if (!tbs_alg || *signature_algorithm != *tbs_alg) {
    return CRLRevocationStatus::UNKNOWN;
  }

  // Check CRL dates. Roughly corresponds to 6.3.3 (a) (1) but does not attempt
  // to update the CRL if it is out of date.
  if (!CheckRevocationDateValid(tbs_cert_list.this_update,
                                tbs_cert_list.next_update.has_value()
                                    ? &tbs_cert_list.next_update.value()
                                    : nullptr,
                                verify_time_epoch_seconds, max_age_seconds)) {
    return CRLRevocationStatus::UNKNOWN;
  }

  // 6.3.3 (a) (2) is skipped: This implementation does not support delta CRLs.

  // 6.3.3 (b) Verify the issuer and scope of the complete CRL as follows:
  // 6.3.3 (b) (1) If the DP includes cRLIssuer, then verify that the issuer
  //               field in the complete CRL matches cRLIssuer in the DP and
  //               that the complete CRL contains an issuing distribution
  //               point extension with the indirectCRL boolean asserted.
  //
  // Nothing is done here since distribution points with crlIssuer were skipped
  // above.

  // 6.3.3 (b) (1) Otherwise, verify that the CRL issuer matches the
  //               certificate issuer.
  //
  // Normalization for the name comparison is used although the RFC is not
  // clear on this. There are several places that explicitly are called out as
  // requiring identical encodings:
  //
  // 4.2.1.13.  CRL Distribution Points (cert extension) says the DP cRLIssuer
  //    field MUST be exactly the same as the encoding in issuer field of the
  //    CRL.
  //
  // 5.2.5.  Issuing Distribution Point (crl extension)
  //    The identical encoding MUST be used in the distributionPoint fields
  //    of the certificate and the CRL.
  //
  // 5.3.3.  Certificate Issuer (crl entry extension) also says "The encoding of
  //    the DN MUST be identical to the encoding used in the certificate"
  //
  // But 6.3.3 (b) (1) just says "matches". Also NIST PKITS includes at least
  // one test that requires normalization here.
  // TODO(https://crbug.com/749276): could do exact comparison first and only
  // fall back to normalizing if that fails.
  std::string normalized_crl_issuer;
  if (!NormalizeNameTLV(tbs_cert_list.issuer_tlv, &normalized_crl_issuer)) {
    return CRLRevocationStatus::UNKNOWN;
  }
  if (der::Input(StringAsBytes(normalized_crl_issuer)) !=
      target_cert->normalized_issuer()) {
    return CRLRevocationStatus::UNKNOWN;
  }

  if (tbs_cert_list.crl_extensions_tlv.has_value()) {
    std::map<der::Input, ParsedExtension> extensions;
    if (!ParseExtensions(*tbs_cert_list.crl_extensions_tlv, &extensions)) {
      return CRLRevocationStatus::UNKNOWN;
    }

    // 6.3.3 (b) (2) If the complete CRL includes an issuing distribution point
    //               (IDP) CRL extension, check the following:
    ParsedExtension idp_extension;
    if (ConsumeExtension(der::Input(kIssuingDistributionPointOid), &extensions,
                         &idp_extension)) {
      std::unique_ptr<GeneralNames> distribution_point_names;
      ContainedCertsType only_contains_cert_type;
      if (!ParseIssuingDistributionPoint(idp_extension.value,
                                         &distribution_point_names,
                                         &only_contains_cert_type)) {
        return CRLRevocationStatus::UNKNOWN;
      }

      if (distribution_point_names) {
        // 6.3.3. (b) (2) (i) If the distribution point name is present in the
        //                    IDP CRL extension and the distribution field is
        //                    present in the DP, then verify that one of the
        //                    names in the IDP matches one of the names in the
        //                    DP.
        // 5.2.5.  The identical encoding MUST be used in the distributionPoint
        //         fields of the certificate and the CRL.
        // TODO(https://crbug.com/749276): Check other name types?
        if (!cert_dp.distribution_point_fullname ||
            !ContainsExactMatchingName(
                cert_dp.distribution_point_fullname
                    ->uniform_resource_identifiers,
                distribution_point_names->uniform_resource_identifiers)) {
          return CRLRevocationStatus::UNKNOWN;
        }

        // 6.3.3. (b) (2) (i) If the distribution point name is present in the
        //                    IDP CRL extension and the distribution field is
        //                    omitted from the DP, then verify that one of the
        //                    names in the IDP matches one of the names in the
        //                    cRLIssuer field of the DP.
        // Indirect CRLs are not supported, if indirectCRL was specified,
        // ParseIssuingDistributionPoint would already have failed.
      }

      switch (only_contains_cert_type) {
        case ContainedCertsType::USER_CERTS:
          // 6.3.3. (b) (2) (ii)  If the onlyContainsUserCerts boolean is
          //                      asserted in the IDP CRL extension, verify
          //                      that the certificate does not include the
          //                      basic constraints extension with the cA
          //                      boolean asserted.
          // 5.2.5.  If either onlyContainsUserCerts or onlyContainsCACerts is
          //         set to TRUE, then the scope of the CRL MUST NOT include any
          //         version 1 or version 2 certificates.
          if ((target_cert->has_basic_constraints() &&
               target_cert->basic_constraints().is_ca) ||
              target_cert->tbs().version == CertificateVersion::V1 ||
              target_cert->tbs().version == CertificateVersion::V2) {
            return CRLRevocationStatus::UNKNOWN;
          }
          break;

        case ContainedCertsType::CA_CERTS:
          // 6.3.3. (b) (2) (iii) If the onlyContainsCACerts boolean is asserted
          //                      in the IDP CRL extension, verify that the
          //                      certificate includes the basic constraints
          //                      extension with the cA boolean asserted.
          // The version check is not done here, as the basicConstraints
          // extension is required, and could not be present unless it is a V3
          // certificate.
          if (!target_cert->has_basic_constraints() ||
              !target_cert->basic_constraints().is_ca) {
            return CRLRevocationStatus::UNKNOWN;
          }
          break;

        case ContainedCertsType::ANY_CERTS:
          //                (iv)  Verify that the onlyContainsAttributeCerts
          //                      boolean is not asserted.
          // If onlyContainsAttributeCerts was present,
          // ParseIssuingDistributionPoint would already have failed.
          break;
      }
    }

    for (const auto &ext : extensions) {
      // Fail if any unhandled critical CRL extensions are present.
      if (ext.second.critical) {
        return CRLRevocationStatus::UNKNOWN;
      }
    }
  }

  // 6.3.3 (c-e) skipped: delta CRLs and reason codes are not supported.

  // This implementation only supports direct CRLs where the CRL was signed by
  // one of the certs in its validated issuer chain. This allows handling some
  // cases of key rollover without requiring additional CRL issuer cert
  // discovery & path building.
  // TODO(https://crbug.com/749276): should this loop start at
  // |target_cert_index|? There doesn't seem to be anything in the specs that
  // precludes a CRL signed by a self-issued cert from covering itself. On the
  // other hand it seems like a pretty weird thing to allow and causes NIST
  // PKITS 4.5.3 to pass when it seems like it would not be intended to (since
  // issuingDistributionPoint CRL extension is not handled).
  for (size_t i = target_cert_index + 1; i < valid_chain.size(); ++i) {
    const ParsedCertificate *issuer_cert = valid_chain[i].get();

    // 6.3.3 (f) Obtain and validate the certification path for the issuer of
    //           the complete CRL.  The trust anchor for the certification
    //           path MUST be the same as the trust anchor used to validate
    //           the target certificate.
    //
    // As the |issuer_cert| is from the already validated chain, it is already
    // known to chain to the same trust anchor as the target certificate.
    if (der::Input(StringAsBytes(normalized_crl_issuer)) !=
        issuer_cert->normalized_subject()) {
      continue;
    }

    // 6.3.3 (f) If a key usage extension is present in the CRL issuer's
    //           certificate, verify that the cRLSign bit is set.
    if (issuer_cert->has_key_usage() &&
        !issuer_cert->key_usage().AssertsBit(KEY_USAGE_BIT_CRL_SIGN)) {
      continue;
    }

    // 6.3.3 (g) Validate the signature on the complete CRL using the public
    //           key validated in step (f).
    if (!VerifySignedData(*signature_algorithm, tbs_cert_list_tlv,
                          signature_value, issuer_cert->tbs().spki_tlv,
                          /*cache=*/nullptr)) {
      continue;
    }

    // 6.3.3 (h,i) skipped. This implementation does not support delta CRLs.

    // 6.3.3 (j) If (cert_status is UNREVOKED), then search for the
    //           certificate on the complete CRL.  If an entry is found that
    //           matches the certificate issuer and serial number as described
    //           in Section 5.3.3, then set the cert_status variable to the
    //           indicated reason as described in step (i).
    //
    // CRL is valid and covers |target_cert|, check if |target_cert| is present
    // in the revokedCertificates sequence.
    return GetCRLStatusForCert(target_cert->tbs().serial_number,
                               tbs_cert_list.version,
                               tbs_cert_list.revoked_certificates_tlv);

    // 6.3.3 (k,l) skipped. This implementation does not support reason codes.
  }

  // Did not find the issuer & signer of |raw_crl| in |valid_chain|.
  return CRLRevocationStatus::UNKNOWN;
}